

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_output_stores_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::EliminateDeadOutputStoresPass::DoDeadOutputStoreElimination
          (EliminateDeadOutputStoresPass *this)

{
  bool bVar1;
  ExecutionModel EVar2;
  Op OVar3;
  uint32_t uVar4;
  int iVar5;
  StorageClass SVar6;
  IRContext *pIVar7;
  DefUseManager *this_00;
  TypeManager *this_01;
  DecorationManager *this_02;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference ppIVar8;
  Instruction **kinst;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2_1;
  Instruction *local_d0;
  bool local_c8;
  function<void_(spvtools::opt::Instruction_*)> local_c0;
  uint32_t local_9c;
  Type *pTStack_98;
  uint32_t str_type_id;
  Struct *str_type;
  Array *arr_type;
  Type *curr_type;
  bool is_builtin;
  Pointer *pPStack_78;
  uint32_t var_id;
  Pointer *ptr_type;
  Type *var_type;
  Instruction *var;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  DecorationManager *deco_mgr;
  TypeManager *type_mgr;
  DefUseManager *def_use_mgr;
  ExecutionModel stage;
  EliminateDeadOutputStoresPass *this_local;
  
  pIVar7 = Pass::context(&this->super_Pass);
  EVar2 = IRContext::GetStage(pIVar7);
  if ((((EVar2 == ExecutionModelVertex) || (EVar2 == ExecutionModelTessellationControl)) ||
      (EVar2 == ExecutionModelTessellationEvaluation)) || (EVar2 == ExecutionModelGeometry)) {
    InitializeElimination(this);
    pIVar7 = Pass::context(&this->super_Pass);
    this_00 = IRContext::get_def_use_mgr(pIVar7);
    pIVar7 = Pass::context(&this->super_Pass);
    this_01 = IRContext::get_type_mgr(pIVar7);
    pIVar7 = Pass::context(&this->super_Pass);
    this_02 = IRContext::get_decoration_mgr(pIVar7);
    Pass::context(&this->super_Pass);
    IRContext::types_values((IRContext *)&__begin2);
    IteratorRange<spvtools::opt::InstructionList::iterator>::begin
              ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
    IteratorRange<spvtools::opt::InstructionList::iterator>::end
              ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&var);
    while (bVar1 = utils::operator!=(&__end2.super_iterator,
                                     (iterator_template<spvtools::opt::Instruction> *)&var), bVar1)
    {
      var_type = (Type *)utils::IntrusiveList<spvtools::opt::Instruction>::
                         iterator_template<spvtools::opt::Instruction>::operator*
                                   (&__end2.super_iterator);
      OVar3 = opt::Instruction::opcode((Instruction *)var_type);
      if (OVar3 == OpVariable) {
        uVar4 = opt::Instruction::type_id((Instruction *)var_type);
        ptr_type = (Pointer *)analysis::TypeManager::GetType(this_01,uVar4);
        iVar5 = (*(ptr_type->super_Type)._vptr_Type[0x21])();
        pPStack_78 = (Pointer *)CONCAT44(extraout_var,iVar5);
        SVar6 = analysis::Pointer::storage_class(pPStack_78);
        if (SVar6 == Output) {
          curr_type._4_4_ = opt::Instruction::result_id((Instruction *)var_type);
          curr_type._3_1_ = 0;
          bVar1 = analysis::DecorationManager::HasDecoration(this_02,curr_type._4_4_,0xb);
          if (bVar1) {
            curr_type._3_1_ = 1;
          }
          else {
            arr_type = (Array *)analysis::Pointer::pointee_type(pPStack_78);
            iVar5 = (*(arr_type->super_Type)._vptr_Type[0x18])();
            str_type = (Struct *)CONCAT44(extraout_var_00,iVar5);
            if (str_type != (Struct *)0x0) {
              arr_type = (Array *)analysis::Array::element_type((Array *)str_type);
            }
            iVar5 = (*(arr_type->super_Type)._vptr_Type[0x1e])();
            pTStack_98 = (Type *)CONCAT44(extraout_var_01,iVar5);
            if (pTStack_98 != (Type *)0x0) {
              local_9c = analysis::TypeManager::GetId(this_01,pTStack_98);
              bVar1 = analysis::DecorationManager::HasDecoration(this_02,local_9c,0xb);
              if (bVar1) {
                curr_type._3_1_ = 1;
              }
            }
          }
          uVar4 = curr_type._4_4_;
          local_d0 = (Instruction *)var_type;
          local_c8 = (bool)(curr_type._3_1_ & 1);
          __range2_1 = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        *)this;
          std::function<void(spvtools::opt::Instruction*)>::
          function<spvtools::opt::EliminateDeadOutputStoresPass::DoDeadOutputStoreElimination()::__0,void>
                    ((function<void(spvtools::opt::Instruction*)> *)&local_c0,
                     (anon_class_24_3_f7677a5a *)&__range2_1);
          analysis::DefUseManager::ForEachUser(this_00,uVar4,&local_c0);
          std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_c0);
        }
      }
      InstructionList::iterator::operator++(&__end2);
    }
    __end2_1 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               begin(&this->kill_list_);
    kinst = (Instruction **)
            std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ::end(&this->kill_list_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                               *)&kinst), bVar1) {
      ppIVar8 = __gnu_cxx::
                __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                ::operator*(&__end2_1);
      pIVar7 = Pass::context(&this->super_Pass);
      IRContext::KillInst(pIVar7,*ppIVar8);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end2_1);
    }
    bVar1 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ::empty(&this->kill_list_);
    this_local._4_4_ = SuccessWithChange;
    if (bVar1) {
      this_local._4_4_ = SuccessWithoutChange;
    }
  }
  else {
    this_local._4_4_ = Failure;
  }
  return this_local._4_4_;
}

Assistant:

Pass::Status EliminateDeadOutputStoresPass::DoDeadOutputStoreElimination() {
  // Current implementation only supports vert, tesc, tese, geom shaders
  auto stage = context()->GetStage();
  if (stage != spv::ExecutionModel::Vertex &&
      stage != spv::ExecutionModel::TessellationControl &&
      stage != spv::ExecutionModel::TessellationEvaluation &&
      stage != spv::ExecutionModel::Geometry)
    return Status::Failure;
  InitializeElimination();
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::DecorationManager* deco_mgr = context()->get_decoration_mgr();
  // Process all output variables
  for (auto& var : context()->types_values()) {
    if (var.opcode() != spv::Op::OpVariable) {
      continue;
    }
    analysis::Type* var_type = type_mgr->GetType(var.type_id());
    analysis::Pointer* ptr_type = var_type->AsPointer();
    if (ptr_type->storage_class() != spv::StorageClass::Output) {
      continue;
    }
    // If builtin decoration on variable, process as builtin.
    auto var_id = var.result_id();
    bool is_builtin = false;
    if (deco_mgr->HasDecoration(var_id, uint32_t(spv::Decoration::BuiltIn))) {
      is_builtin = true;
    } else {
      // If interface block with builtin members, process as builtin.
      // Strip off outer array type if present.
      auto curr_type = ptr_type->pointee_type();
      auto arr_type = curr_type->AsArray();
      if (arr_type) curr_type = arr_type->element_type();
      auto str_type = curr_type->AsStruct();
      if (str_type) {
        auto str_type_id = type_mgr->GetId(str_type);
        if (deco_mgr->HasDecoration(str_type_id,
                                    uint32_t(spv::Decoration::BuiltIn)))
          is_builtin = true;
      }
    }
    // For each store or access chain using var, if dead builtin or all its
    // locations are dead, kill store or all access chain's stores
    def_use_mgr->ForEachUser(
        var_id, [this, &var, is_builtin](Instruction* user) {
          auto op = user->opcode();
          if (op == spv::Op::OpEntryPoint || op == spv::Op::OpName ||
              op == spv::Op::OpDecorate || user->IsNonSemanticInstruction())
            return;
          if (is_builtin)
            KillAllDeadStoresOfBuiltinRef(user, &var);
          else
            KillAllDeadStoresOfLocRef(user, &var);
        });
  }
  for (auto& kinst : kill_list_) context()->KillInst(kinst);

  return kill_list_.empty() ? Status::SuccessWithoutChange
                            : Status::SuccessWithChange;
}